

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint ssize;
  double *pdVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  ulong uVar4;
  ulong uVar5;
  value_type vVar6;
  
  pFVar3 = (fadexpr->fadexpr_).right_;
  ssize = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
    pFVar3 = (fadexpr->fadexpr_).right_;
  }
  if (ssize != 0) {
    pdVar1 = (this->dx_).ptr_to_data;
    pFVar2 = (pFVar3->fadexpr_).right_;
    if ((pFVar2->dx_).num_elts == 0) {
      uVar4 = 0;
      uVar5 = (ulong)ssize;
      if ((int)ssize < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        vVar6 = FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar4);
        pdVar1[uVar4] = vVar6;
      }
      pFVar3 = (fadexpr->fadexpr_).right_;
    }
    else {
      uVar4 = 0;
      uVar5 = (ulong)ssize;
      if ((int)ssize < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        pdVar1[uVar4] = (pFVar2->dx_).ptr_to_data[uVar4] * (fadexpr->fadexpr_).left_.constant_;
      }
    }
  }
  this->val_ = ((pFVar3->fadexpr_).left_.constant_ + ((pFVar3->fadexpr_).right_)->val_) *
               (fadexpr->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}